

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

size_t __thiscall
google::protobuf::internal::MapFieldBase::SpaceUsedExcludingSelfLong(MapFieldBase *this)

{
  TaggedPtr p;
  ReflectionPayload *pRVar1;
  UntypedMapBase *pUVar2;
  undefined1 in_SIL;
  
  p = (this->payload_)._M_i;
  if (((p & 1) != 0) && (pRVar1 = ToPayload(p), pRVar1 != (ReflectionPayload *)0x0)) {
    absl::lts_20240722::Mutex::Lock();
    pUVar2 = (*(this->super_MapFieldBaseForParse).vtable_[9].get_map)
                       (&this->super_MapFieldBaseForParse,(bool)in_SIL);
    absl::lts_20240722::Mutex::Unlock();
    return (size_t)pUVar2;
  }
  return 0;
}

Assistant:

size_t MapFieldBase::SpaceUsedExcludingSelfLong() const {
  ConstAccess();
  size_t size = 0;
  if (auto* p = maybe_payload()) {
    {
      absl::MutexLock lock(&p->mutex);
      size = SpaceUsedExcludingSelfNoLock();
    }
    ConstAccess();
  }
  return size;
}